

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O0

void __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::set_bit
          (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
           *this,int pos)

{
  bool bVar1;
  int in_ESI;
  long in_RDI;
  int bit_pos;
  int bitmap_pos;
  
  bVar1 = false;
  if (-1 < in_ESI) {
    bVar1 = in_ESI < *(int *)(in_RDI + 0x58);
  }
  if (!bVar1) {
    __assert_fail("pos >= 0 && pos < data_capacity_",
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex_nodes.h"
                  ,0x1e4,
                  "void alex::AlexDataNode<int, int>::set_bit(int) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = true]"
                 );
  }
  *(ulong *)(*(long *)(in_RDI + 0x60) + (long)(in_ESI >> 6) * 8) =
       1L << ((byte)in_ESI & 0x3f) | *(ulong *)(*(long *)(in_RDI + 0x60) + (long)(in_ESI >> 6) * 8);
  return;
}

Assistant:

inline void set_bit(int pos) {
    assert(pos >= 0 && pos < data_capacity_);
    int bitmap_pos = pos >> 6;
    int bit_pos = pos - (bitmap_pos << 6);
    bitmap_[bitmap_pos] |= (1ULL << bit_pos);
  }